

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O3

void aom_lpf_horizontal_8_quad_sse2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  unkuint9 Var60;
  undefined1 auVar61 [11];
  undefined1 auVar62 [15];
  unkuint9 Var63;
  undefined1 auVar64 [11];
  undefined1 auVar65 [15];
  unkuint9 Var66;
  undefined1 auVar67 [11];
  undefined1 auVar68 [13];
  undefined1 auVar69 [15];
  unkuint9 Var70;
  undefined1 auVar71 [11];
  undefined1 auVar72 [15];
  unkuint9 Var73;
  undefined1 auVar74 [11];
  undefined1 auVar75 [15];
  unkuint9 Var76;
  undefined1 auVar77 [11];
  undefined1 auVar78 [15];
  unkuint9 Var79;
  undefined1 auVar80 [11];
  undefined1 auVar81 [15];
  unkuint9 Var82;
  undefined1 auVar83 [11];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  long lVar100;
  byte bVar101;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  byte bVar107;
  byte bVar108;
  byte bVar110;
  ushort uVar109;
  byte bVar111;
  byte bVar112;
  byte bVar113;
  byte bVar114;
  byte bVar115;
  byte bVar116;
  byte bVar117;
  undefined1 auVar102 [16];
  byte bVar118;
  ushort uVar119;
  ushort uVar120;
  ushort uVar121;
  ushort uVar122;
  ushort uVar123;
  ushort uVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar131;
  short sVar132;
  short sVar133;
  short sVar134;
  ushort uVar135;
  short sVar136;
  short sVar137;
  undefined1 auVar138 [16];
  ushort uVar140;
  undefined1 auVar139 [16];
  short sVar141;
  short sVar142;
  ushort uVar143;
  short sVar144;
  ushort uVar145;
  short sVar146;
  ushort uVar147;
  short sVar148;
  ushort uVar149;
  short sVar150;
  ushort uVar151;
  short sVar152;
  ushort uVar153;
  short sVar154;
  ushort uVar155;
  short sVar156;
  ushort uVar157;
  byte bVar158;
  byte bVar162;
  ushort uVar159;
  short sVar160;
  byte bVar163;
  byte bVar165;
  short sVar164;
  byte bVar166;
  byte bVar168;
  short sVar167;
  byte bVar169;
  byte bVar171;
  short sVar170;
  byte bVar172;
  byte bVar174;
  short sVar173;
  byte bVar175;
  byte bVar177;
  short sVar176;
  byte bVar178;
  byte bVar180;
  short sVar179;
  byte bVar181;
  undefined1 auVar161 [16];
  byte bVar183;
  short sVar182;
  ushort uVar184;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  byte bVar187;
  byte bVar189;
  ushort uVar188;
  byte bVar190;
  byte bVar193;
  short sVar191;
  ushort uVar192;
  byte bVar194;
  byte bVar197;
  short sVar195;
  ushort uVar196;
  byte bVar198;
  byte bVar201;
  short sVar199;
  ushort uVar200;
  byte bVar202;
  byte bVar205;
  short sVar203;
  ushort uVar204;
  byte bVar206;
  byte bVar209;
  short sVar207;
  ushort uVar208;
  byte bVar210;
  byte bVar213;
  short sVar211;
  ushort uVar212;
  byte bVar214;
  byte bVar216;
  byte bVar217;
  ushort uVar215;
  ushort uVar218;
  short sVar220;
  short sVar221;
  short sVar222;
  short sVar223;
  short sVar224;
  short sVar225;
  undefined1 auVar219 [16];
  ushort uVar226;
  ushort uVar229;
  ushort uVar230;
  ushort uVar231;
  ushort uVar232;
  ushort uVar233;
  ushort uVar234;
  undefined1 auVar227 [16];
  ushort uVar235;
  undefined1 auVar228 [16];
  ushort uVar236;
  ushort uVar238;
  ushort uVar239;
  undefined1 auVar237 [16];
  ushort uVar240;
  short sVar243;
  short sVar244;
  short sVar245;
  short sVar246;
  short sVar247;
  short sVar248;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  ushort uVar249;
  ushort uVar252;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  ushort uVar253;
  ushort uVar255;
  ushort uVar256;
  ushort uVar257;
  ushort uVar258;
  ushort uVar259;
  ushort uVar260;
  ushort uVar261;
  undefined1 auVar254 [16];
  ushort uStack_116;
  ushort uStack_114;
  ushort uStack_112;
  ushort uStack_110;
  ushort uStack_10e;
  ushort uStack_10c;
  ushort uStack_10a;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  ushort uStack_100;
  ushort uStack_fe;
  ushort uStack_fc;
  ushort uStack_fa;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  ushort uStack_e6;
  ushort uStack_e4;
  ushort uStack_e2;
  ushort uStack_e0;
  ushort uStack_de;
  ushort uStack_dc;
  ushort uStack_da;
  ushort uStack_d6;
  ushort uStack_d4;
  ushort uStack_d2;
  ushort uStack_d0;
  ushort uStack_ce;
  ushort uStack_cc;
  ushort uStack_ca;
  ushort uStack_c6;
  ushort uStack_c4;
  ushort uStack_c2;
  ushort uStack_c0;
  ushort uStack_be;
  ushort uStack_bc;
  ushort uStack_ba;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ushort uStack_26;
  ushort uStack_24;
  ushort uStack_22;
  ushort uStack_20;
  ushort uStack_1e;
  ushort uStack_1c;
  ushort uStack_1a;
  short sStack_16;
  short sStack_14;
  short sStack_12;
  short sStack_10;
  short sStack_e;
  short sStack_c;
  short sVar130;
  
  auVar139 = *(undefined1 (*) [16])(s + -(long)(p * 4));
  lVar100 = (long)p;
  auVar228 = *(undefined1 (*) [16])(s + lVar100 * -3);
  auVar237 = *(undefined1 (*) [16])(s + lVar100 * -2);
  auVar242 = *(undefined1 (*) [16])(s + -lVar100);
  auVar251 = *(undefined1 (*) [16])s;
  auVar1 = *(undefined1 (*) [16])(s + lVar100);
  auVar2 = *(undefined1 (*) [16])(s + lVar100 * 2);
  auVar254 = *(undefined1 (*) [16])(s + lVar100 * 3);
  auVar102 = psubusb(auVar237,auVar242);
  auVar138 = psubusb(auVar242,auVar237);
  auVar138 = auVar138 | auVar102;
  auVar161 = psubusb(auVar1,auVar251);
  auVar102 = psubusb(auVar251,auVar1);
  auVar102 = auVar102 | auVar161;
  bVar216 = auVar138[0];
  bVar158 = auVar102[0];
  bVar101 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[1];
  bVar158 = auVar102[1];
  bVar103 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[2];
  bVar158 = auVar102[2];
  bVar104 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[3];
  bVar158 = auVar102[3];
  bVar105 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[4];
  bVar158 = auVar102[4];
  bVar106 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[5];
  bVar158 = auVar102[5];
  bVar107 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[6];
  bVar158 = auVar102[6];
  bVar108 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[7];
  bVar158 = auVar102[7];
  bVar110 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[8];
  bVar158 = auVar102[8];
  bVar111 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[9];
  bVar158 = auVar102[9];
  bVar112 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[10];
  bVar158 = auVar102[10];
  bVar113 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[0xb];
  bVar158 = auVar102[0xb];
  bVar114 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[0xc];
  bVar158 = auVar102[0xc];
  bVar115 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[0xd];
  bVar158 = auVar102[0xd];
  bVar116 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[0xe];
  bVar158 = auVar102[0xe];
  bVar162 = auVar102[0xf];
  bVar117 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[0xf];
  bVar118 = (bVar162 < bVar216) * bVar216 | (bVar162 >= bVar216) * bVar162;
  auVar102 = psubusb(auVar242,auVar251);
  auVar161 = psubusb(auVar251,auVar242);
  auVar138 = psubusb(auVar237,auVar1);
  auVar185 = psubusb(auVar1,auVar237);
  auVar185 = auVar185 | auVar138;
  auVar102 = paddusb(auVar161 | auVar102,auVar161 | auVar102);
  auVar138._0_2_ = auVar185._0_2_ >> 1;
  auVar138._2_2_ = auVar185._2_2_ >> 1;
  auVar138._4_2_ = auVar185._4_2_ >> 1;
  auVar138._6_2_ = auVar185._6_2_ >> 1;
  auVar138._8_2_ = auVar185._8_2_ >> 1;
  auVar138._10_2_ = auVar185._10_2_ >> 1;
  auVar138._12_2_ = auVar185._12_2_ >> 1;
  auVar138._14_2_ = auVar185._14_2_ >> 1;
  auVar102 = paddusb(auVar138 & _DAT_004c7fc0,auVar102);
  bVar183 = *_blimit0;
  bVar187 = _blimit0[1];
  bVar189 = _blimit0[2];
  bVar190 = _blimit0[3];
  bVar193 = _blimit0[4];
  bVar194 = _blimit0[5];
  bVar197 = _blimit0[6];
  bVar198 = _blimit0[7];
  bVar201 = _blimit0[8];
  bVar202 = _blimit0[9];
  bVar205 = _blimit0[10];
  bVar206 = _blimit0[0xb];
  bVar209 = _blimit0[0xc];
  bVar210 = _blimit0[0xd];
  bVar213 = _blimit0[0xe];
  bVar214 = _blimit0[0xf];
  bVar216 = auVar102[0];
  bVar158 = auVar102[1];
  bVar162 = auVar102[2];
  bVar163 = auVar102[3];
  bVar165 = auVar102[4];
  bVar166 = auVar102[5];
  bVar168 = auVar102[6];
  bVar169 = auVar102[7];
  bVar171 = auVar102[8];
  bVar172 = auVar102[9];
  bVar174 = auVar102[10];
  bVar175 = auVar102[0xb];
  bVar177 = auVar102[0xc];
  bVar178 = auVar102[0xd];
  bVar180 = auVar102[0xe];
  bVar181 = auVar102[0xf];
  bVar216 = -((byte)((bVar216 < bVar183) * bVar216 | (bVar216 >= bVar183) * bVar183) == bVar216) ^
            0xff;
  bVar183 = -((byte)((bVar158 < bVar187) * bVar158 | (bVar158 >= bVar187) * bVar187) == bVar158) ^
            0xff;
  bVar187 = -((byte)((bVar162 < bVar189) * bVar162 | (bVar162 >= bVar189) * bVar189) == bVar162) ^
            0xff;
  bVar189 = -((byte)((bVar163 < bVar190) * bVar163 | (bVar163 >= bVar190) * bVar190) == bVar163) ^
            0xff;
  bVar190 = -((byte)((bVar165 < bVar193) * bVar165 | (bVar165 >= bVar193) * bVar193) == bVar165) ^
            0xff;
  bVar193 = -((byte)((bVar166 < bVar194) * bVar166 | (bVar166 >= bVar194) * bVar194) == bVar166) ^
            0xff;
  bVar194 = -((byte)((bVar168 < bVar197) * bVar168 | (bVar168 >= bVar197) * bVar197) == bVar168) ^
            0xff;
  bVar197 = -((byte)((bVar169 < bVar198) * bVar169 | (bVar169 >= bVar198) * bVar198) == bVar169) ^
            0xff;
  bVar198 = -((byte)((bVar171 < bVar201) * bVar171 | (bVar171 >= bVar201) * bVar201) == bVar171) ^
            0xff;
  bVar201 = -((byte)((bVar172 < bVar202) * bVar172 | (bVar172 >= bVar202) * bVar202) == bVar172) ^
            0xff;
  bVar202 = -((byte)((bVar174 < bVar205) * bVar174 | (bVar174 >= bVar205) * bVar205) == bVar174) ^
            0xff;
  bVar205 = -((byte)((bVar175 < bVar206) * bVar175 | (bVar175 >= bVar206) * bVar206) == bVar175) ^
            0xff;
  bVar206 = -((byte)((bVar177 < bVar209) * bVar177 | (bVar177 >= bVar209) * bVar209) == bVar177) ^
            0xff;
  bVar209 = -((byte)((bVar178 < bVar210) * bVar178 | (bVar178 >= bVar210) * bVar210) == bVar178) ^
            0xff;
  bVar210 = -((byte)((bVar180 < bVar213) * bVar180 | (bVar180 >= bVar213) * bVar213) == bVar180) ^
            0xff;
  bVar213 = -((byte)((bVar181 < bVar214) * bVar181 | (bVar181 >= bVar214) * bVar214) == bVar181) ^
            0xff;
  bVar158 = (bVar216 < bVar101) * bVar101 | (bVar216 >= bVar101) * bVar216;
  bVar162 = (bVar183 < bVar103) * bVar103 | (bVar183 >= bVar103) * bVar183;
  bVar163 = (bVar187 < bVar104) * bVar104 | (bVar187 >= bVar104) * bVar187;
  bVar165 = (bVar189 < bVar105) * bVar105 | (bVar189 >= bVar105) * bVar189;
  bVar166 = (bVar190 < bVar106) * bVar106 | (bVar190 >= bVar106) * bVar190;
  bVar168 = (bVar193 < bVar107) * bVar107 | (bVar193 >= bVar107) * bVar193;
  bVar169 = (bVar194 < bVar108) * bVar108 | (bVar194 >= bVar108) * bVar194;
  bVar171 = (bVar197 < bVar110) * bVar110 | (bVar197 >= bVar110) * bVar197;
  bVar172 = (bVar198 < bVar111) * bVar111 | (bVar198 >= bVar111) * bVar198;
  bVar174 = (bVar201 < bVar112) * bVar112 | (bVar201 >= bVar112) * bVar201;
  bVar175 = (bVar202 < bVar113) * bVar113 | (bVar202 >= bVar113) * bVar202;
  bVar177 = (bVar205 < bVar114) * bVar114 | (bVar205 >= bVar114) * bVar205;
  bVar178 = (bVar206 < bVar115) * bVar115 | (bVar206 >= bVar115) * bVar206;
  bVar180 = (bVar209 < bVar116) * bVar116 | (bVar209 >= bVar116) * bVar209;
  bVar181 = (bVar210 < bVar117) * bVar117 | (bVar210 >= bVar117) * bVar210;
  bVar183 = (bVar213 < bVar118) * bVar118 | (bVar213 >= bVar118) * bVar213;
  auVar102 = psubusb(auVar228,auVar237);
  auVar138 = psubusb(auVar237,auVar228);
  auVar138 = auVar138 | auVar102;
  auVar102 = psubusb(auVar139,auVar228);
  auVar161 = psubusb(auVar228,auVar139);
  auVar161 = auVar161 | auVar102;
  bVar216 = auVar138[0];
  bVar187 = auVar161[0];
  bVar187 = (bVar187 < bVar216) * bVar216 | (bVar187 >= bVar216) * bVar187;
  bVar216 = auVar138[1];
  bVar189 = auVar161[1];
  bVar189 = (bVar189 < bVar216) * bVar216 | (bVar189 >= bVar216) * bVar189;
  bVar216 = auVar138[2];
  bVar190 = auVar161[2];
  bVar190 = (bVar190 < bVar216) * bVar216 | (bVar190 >= bVar216) * bVar190;
  bVar216 = auVar138[3];
  bVar193 = auVar161[3];
  bVar193 = (bVar193 < bVar216) * bVar216 | (bVar193 >= bVar216) * bVar193;
  bVar216 = auVar138[4];
  bVar194 = auVar161[4];
  bVar194 = (bVar194 < bVar216) * bVar216 | (bVar194 >= bVar216) * bVar194;
  bVar216 = auVar138[5];
  bVar197 = auVar161[5];
  bVar197 = (bVar197 < bVar216) * bVar216 | (bVar197 >= bVar216) * bVar197;
  bVar216 = auVar138[6];
  bVar198 = auVar161[6];
  bVar198 = (bVar198 < bVar216) * bVar216 | (bVar198 >= bVar216) * bVar198;
  bVar216 = auVar138[7];
  bVar201 = auVar161[7];
  bVar201 = (bVar201 < bVar216) * bVar216 | (bVar201 >= bVar216) * bVar201;
  bVar216 = auVar138[8];
  bVar202 = auVar161[8];
  bVar202 = (bVar202 < bVar216) * bVar216 | (bVar202 >= bVar216) * bVar202;
  bVar216 = auVar138[9];
  bVar205 = auVar161[9];
  bVar205 = (bVar205 < bVar216) * bVar216 | (bVar205 >= bVar216) * bVar205;
  bVar216 = auVar138[10];
  bVar206 = auVar161[10];
  bVar206 = (bVar206 < bVar216) * bVar216 | (bVar206 >= bVar216) * bVar206;
  bVar216 = auVar138[0xb];
  bVar209 = auVar161[0xb];
  bVar209 = (bVar209 < bVar216) * bVar216 | (bVar209 >= bVar216) * bVar209;
  bVar216 = auVar138[0xc];
  bVar210 = auVar161[0xc];
  bVar210 = (bVar210 < bVar216) * bVar216 | (bVar210 >= bVar216) * bVar210;
  bVar216 = auVar138[0xd];
  bVar213 = auVar161[0xd];
  bVar213 = (bVar213 < bVar216) * bVar216 | (bVar213 >= bVar216) * bVar213;
  bVar216 = auVar138[0xe];
  bVar214 = auVar161[0xe];
  bVar217 = auVar161[0xf];
  bVar214 = (bVar214 < bVar216) * bVar216 | (bVar214 >= bVar216) * bVar214;
  bVar216 = auVar138[0xf];
  bVar216 = (bVar217 < bVar216) * bVar216 | (bVar217 >= bVar216) * bVar217;
  bVar187 = (bVar187 < bVar158) * bVar158 | (bVar187 >= bVar158) * bVar187;
  bVar189 = (bVar189 < bVar162) * bVar162 | (bVar189 >= bVar162) * bVar189;
  bVar190 = (bVar190 < bVar163) * bVar163 | (bVar190 >= bVar163) * bVar190;
  bVar193 = (bVar193 < bVar165) * bVar165 | (bVar193 >= bVar165) * bVar193;
  bVar194 = (bVar194 < bVar166) * bVar166 | (bVar194 >= bVar166) * bVar194;
  bVar197 = (bVar197 < bVar168) * bVar168 | (bVar197 >= bVar168) * bVar197;
  bVar198 = (bVar198 < bVar169) * bVar169 | (bVar198 >= bVar169) * bVar198;
  bVar201 = (bVar201 < bVar171) * bVar171 | (bVar201 >= bVar171) * bVar201;
  bVar202 = (bVar202 < bVar172) * bVar172 | (bVar202 >= bVar172) * bVar202;
  bVar205 = (bVar205 < bVar174) * bVar174 | (bVar205 >= bVar174) * bVar205;
  bVar206 = (bVar206 < bVar175) * bVar175 | (bVar206 >= bVar175) * bVar206;
  bVar209 = (bVar209 < bVar177) * bVar177 | (bVar209 >= bVar177) * bVar209;
  bVar210 = (bVar210 < bVar178) * bVar178 | (bVar210 >= bVar178) * bVar210;
  bVar213 = (bVar213 < bVar180) * bVar180 | (bVar213 >= bVar180) * bVar213;
  bVar214 = (bVar214 < bVar181) * bVar181 | (bVar214 >= bVar181) * bVar214;
  bVar217 = (bVar216 < bVar183) * bVar183 | (bVar216 >= bVar183) * bVar216;
  auVar102 = psubusb(auVar2,auVar1);
  auVar138 = psubusb(auVar1,auVar2);
  auVar138 = auVar138 | auVar102;
  auVar102 = psubusb(auVar254,auVar2);
  auVar161 = psubusb(auVar2,auVar254);
  auVar161 = auVar161 | auVar102;
  bVar216 = auVar138[0];
  bVar158 = auVar161[0];
  bVar158 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
  bVar216 = auVar138[1];
  bVar162 = auVar161[1];
  bVar162 = (bVar162 < bVar216) * bVar216 | (bVar162 >= bVar216) * bVar162;
  bVar216 = auVar138[2];
  bVar163 = auVar161[2];
  bVar163 = (bVar163 < bVar216) * bVar216 | (bVar163 >= bVar216) * bVar163;
  bVar216 = auVar138[3];
  bVar165 = auVar161[3];
  bVar165 = (bVar165 < bVar216) * bVar216 | (bVar165 >= bVar216) * bVar165;
  bVar216 = auVar138[4];
  bVar166 = auVar161[4];
  bVar166 = (bVar166 < bVar216) * bVar216 | (bVar166 >= bVar216) * bVar166;
  bVar216 = auVar138[5];
  bVar168 = auVar161[5];
  bVar168 = (bVar168 < bVar216) * bVar216 | (bVar168 >= bVar216) * bVar168;
  bVar216 = auVar138[6];
  bVar169 = auVar161[6];
  bVar169 = (bVar169 < bVar216) * bVar216 | (bVar169 >= bVar216) * bVar169;
  bVar216 = auVar138[7];
  bVar171 = auVar161[7];
  bVar171 = (bVar171 < bVar216) * bVar216 | (bVar171 >= bVar216) * bVar171;
  bVar216 = auVar138[8];
  bVar172 = auVar161[8];
  bVar172 = (bVar172 < bVar216) * bVar216 | (bVar172 >= bVar216) * bVar172;
  bVar216 = auVar138[9];
  bVar174 = auVar161[9];
  bVar174 = (bVar174 < bVar216) * bVar216 | (bVar174 >= bVar216) * bVar174;
  bVar216 = auVar138[10];
  bVar175 = auVar161[10];
  bVar175 = (bVar175 < bVar216) * bVar216 | (bVar175 >= bVar216) * bVar175;
  bVar216 = auVar138[0xb];
  bVar177 = auVar161[0xb];
  bVar177 = (bVar177 < bVar216) * bVar216 | (bVar177 >= bVar216) * bVar177;
  bVar216 = auVar138[0xc];
  bVar178 = auVar161[0xc];
  bVar178 = (bVar178 < bVar216) * bVar216 | (bVar178 >= bVar216) * bVar178;
  bVar216 = auVar138[0xd];
  bVar180 = auVar161[0xd];
  bVar180 = (bVar180 < bVar216) * bVar216 | (bVar180 >= bVar216) * bVar180;
  bVar216 = auVar138[0xe];
  bVar181 = auVar161[0xe];
  bVar183 = auVar161[0xf];
  bVar181 = (bVar181 < bVar216) * bVar216 | (bVar181 >= bVar216) * bVar181;
  bVar216 = auVar138[0xf];
  bVar216 = (bVar183 < bVar216) * bVar216 | (bVar183 >= bVar216) * bVar183;
  bVar183 = (bVar158 < bVar187) * bVar187 | (bVar158 >= bVar187) * bVar158;
  bVar187 = (bVar162 < bVar189) * bVar189 | (bVar162 >= bVar189) * bVar162;
  bVar189 = (bVar163 < bVar190) * bVar190 | (bVar163 >= bVar190) * bVar163;
  bVar190 = (bVar165 < bVar193) * bVar193 | (bVar165 >= bVar193) * bVar165;
  bVar193 = (bVar166 < bVar194) * bVar194 | (bVar166 >= bVar194) * bVar166;
  bVar194 = (bVar168 < bVar197) * bVar197 | (bVar168 >= bVar197) * bVar168;
  bVar197 = (bVar169 < bVar198) * bVar198 | (bVar169 >= bVar198) * bVar169;
  bVar198 = (bVar171 < bVar201) * bVar201 | (bVar171 >= bVar201) * bVar171;
  bVar201 = (bVar172 < bVar202) * bVar202 | (bVar172 >= bVar202) * bVar172;
  bVar202 = (bVar174 < bVar205) * bVar205 | (bVar174 >= bVar205) * bVar174;
  bVar205 = (bVar175 < bVar206) * bVar206 | (bVar175 >= bVar206) * bVar175;
  bVar206 = (bVar177 < bVar209) * bVar209 | (bVar177 >= bVar209) * bVar177;
  bVar209 = (bVar178 < bVar210) * bVar210 | (bVar178 >= bVar210) * bVar178;
  bVar210 = (bVar180 < bVar213) * bVar213 | (bVar180 >= bVar213) * bVar180;
  bVar213 = (bVar181 < bVar214) * bVar214 | (bVar181 >= bVar214) * bVar181;
  bVar214 = (bVar216 < bVar217) * bVar217 | (bVar216 >= bVar217) * bVar216;
  bVar216 = *_limit0;
  bVar158 = _limit0[1];
  bVar162 = _limit0[2];
  bVar163 = _limit0[3];
  bVar165 = _limit0[4];
  bVar166 = _limit0[5];
  bVar168 = _limit0[6];
  bVar169 = _limit0[7];
  bVar171 = _limit0[8];
  bVar172 = _limit0[9];
  bVar174 = _limit0[10];
  bVar175 = _limit0[0xb];
  bVar177 = _limit0[0xc];
  bVar178 = _limit0[0xd];
  bVar180 = _limit0[0xe];
  bVar181 = _limit0[0xf];
  auVar102[0] = -((byte)((bVar183 < bVar216) * bVar183 | (bVar183 >= bVar216) * bVar216) == bVar183)
  ;
  auVar102[1] = -((byte)((bVar187 < bVar158) * bVar187 | (bVar187 >= bVar158) * bVar158) == bVar187)
  ;
  auVar102[2] = -((byte)((bVar189 < bVar162) * bVar189 | (bVar189 >= bVar162) * bVar162) == bVar189)
  ;
  auVar102[3] = -((byte)((bVar190 < bVar163) * bVar190 | (bVar190 >= bVar163) * bVar163) == bVar190)
  ;
  auVar102[4] = -((byte)((bVar193 < bVar165) * bVar193 | (bVar193 >= bVar165) * bVar165) == bVar193)
  ;
  auVar102[5] = -((byte)((bVar194 < bVar166) * bVar194 | (bVar194 >= bVar166) * bVar166) == bVar194)
  ;
  auVar102[6] = -((byte)((bVar197 < bVar168) * bVar197 | (bVar197 >= bVar168) * bVar168) == bVar197)
  ;
  auVar102[7] = -((byte)((bVar198 < bVar169) * bVar198 | (bVar198 >= bVar169) * bVar169) == bVar198)
  ;
  auVar102[8] = -((byte)((bVar201 < bVar171) * bVar201 | (bVar201 >= bVar171) * bVar171) == bVar201)
  ;
  auVar102[9] = -((byte)((bVar202 < bVar172) * bVar202 | (bVar202 >= bVar172) * bVar172) == bVar202)
  ;
  auVar102[10] = -((byte)((bVar205 < bVar174) * bVar205 | (bVar205 >= bVar174) * bVar174) == bVar205
                  );
  auVar102[0xb] =
       -((byte)((bVar206 < bVar175) * bVar206 | (bVar206 >= bVar175) * bVar175) == bVar206);
  auVar102[0xc] =
       -((byte)((bVar209 < bVar177) * bVar209 | (bVar209 >= bVar177) * bVar177) == bVar209);
  auVar102[0xd] =
       -((byte)((bVar210 < bVar178) * bVar210 | (bVar210 >= bVar178) * bVar178) == bVar210);
  auVar102[0xe] =
       -((byte)((bVar213 < bVar180) * bVar213 | (bVar213 >= bVar180) * bVar180) == bVar213);
  bVar3 = (byte)((bVar214 < bVar181) * bVar214 | (bVar214 >= bVar181) * bVar181) == bVar214;
  auVar102[0xf] = -bVar3;
  if ((((((((((((((((auVar102 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar102 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar102 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar102 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar102 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar102 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar102 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar102 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar102 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar102 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar102 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar102 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar102 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar102 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar102 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar3) {
    auVar138 = psubusb(auVar228,auVar242);
    auVar161 = psubusb(auVar242,auVar228);
    auVar161 = auVar161 | auVar138;
    auVar138 = psubusb(auVar2,auVar251);
    auVar185 = psubusb(auVar251,auVar2);
    auVar185 = auVar185 | auVar138;
    bVar216 = auVar161[0];
    bVar158 = auVar185[0];
    bVar158 = (bVar158 < bVar216) * bVar216 | (bVar158 >= bVar216) * bVar158;
    bVar216 = auVar161[1];
    bVar162 = auVar185[1];
    bVar162 = (bVar162 < bVar216) * bVar216 | (bVar162 >= bVar216) * bVar162;
    bVar216 = auVar161[2];
    bVar163 = auVar185[2];
    bVar163 = (bVar163 < bVar216) * bVar216 | (bVar163 >= bVar216) * bVar163;
    bVar216 = auVar161[3];
    bVar165 = auVar185[3];
    bVar165 = (bVar165 < bVar216) * bVar216 | (bVar165 >= bVar216) * bVar165;
    bVar216 = auVar161[4];
    bVar166 = auVar185[4];
    bVar166 = (bVar166 < bVar216) * bVar216 | (bVar166 >= bVar216) * bVar166;
    bVar216 = auVar161[5];
    bVar168 = auVar185[5];
    bVar168 = (bVar168 < bVar216) * bVar216 | (bVar168 >= bVar216) * bVar168;
    bVar216 = auVar161[6];
    bVar169 = auVar185[6];
    bVar169 = (bVar169 < bVar216) * bVar216 | (bVar169 >= bVar216) * bVar169;
    bVar216 = auVar161[7];
    bVar171 = auVar185[7];
    bVar171 = (bVar171 < bVar216) * bVar216 | (bVar171 >= bVar216) * bVar171;
    bVar216 = auVar161[8];
    bVar172 = auVar185[8];
    bVar172 = (bVar172 < bVar216) * bVar216 | (bVar172 >= bVar216) * bVar172;
    bVar216 = auVar161[9];
    bVar174 = auVar185[9];
    bVar174 = (bVar174 < bVar216) * bVar216 | (bVar174 >= bVar216) * bVar174;
    bVar216 = auVar161[10];
    bVar175 = auVar185[10];
    bVar175 = (bVar175 < bVar216) * bVar216 | (bVar175 >= bVar216) * bVar175;
    bVar216 = auVar161[0xb];
    bVar177 = auVar185[0xb];
    bVar177 = (bVar177 < bVar216) * bVar216 | (bVar177 >= bVar216) * bVar177;
    bVar216 = auVar161[0xc];
    bVar178 = auVar185[0xc];
    bVar178 = (bVar178 < bVar216) * bVar216 | (bVar178 >= bVar216) * bVar178;
    bVar216 = auVar161[0xd];
    bVar180 = auVar185[0xd];
    bVar180 = (bVar180 < bVar216) * bVar216 | (bVar180 >= bVar216) * bVar180;
    bVar216 = auVar161[0xe];
    bVar181 = auVar185[0xe];
    bVar183 = auVar185[0xf];
    bVar181 = (bVar181 < bVar216) * bVar216 | (bVar181 >= bVar216) * bVar181;
    bVar216 = auVar161[0xf];
    bVar216 = (bVar183 < bVar216) * bVar216 | (bVar183 >= bVar216) * bVar183;
    bVar158 = (bVar158 < bVar101) * bVar101 | (bVar158 >= bVar101) * bVar158;
    bVar162 = (bVar162 < bVar103) * bVar103 | (bVar162 >= bVar103) * bVar162;
    bVar163 = (bVar163 < bVar104) * bVar104 | (bVar163 >= bVar104) * bVar163;
    bVar165 = (bVar165 < bVar105) * bVar105 | (bVar165 >= bVar105) * bVar165;
    bVar166 = (bVar166 < bVar106) * bVar106 | (bVar166 >= bVar106) * bVar166;
    bVar168 = (bVar168 < bVar107) * bVar107 | (bVar168 >= bVar107) * bVar168;
    bVar169 = (bVar169 < bVar108) * bVar108 | (bVar169 >= bVar108) * bVar169;
    bVar171 = (bVar171 < bVar110) * bVar110 | (bVar171 >= bVar110) * bVar171;
    bVar172 = (bVar172 < bVar111) * bVar111 | (bVar172 >= bVar111) * bVar172;
    bVar174 = (bVar174 < bVar112) * bVar112 | (bVar174 >= bVar112) * bVar174;
    bVar175 = (bVar175 < bVar113) * bVar113 | (bVar175 >= bVar113) * bVar175;
    bVar177 = (bVar177 < bVar114) * bVar114 | (bVar177 >= bVar114) * bVar177;
    bVar178 = (bVar178 < bVar115) * bVar115 | (bVar178 >= bVar115) * bVar178;
    bVar180 = (bVar180 < bVar116) * bVar116 | (bVar180 >= bVar116) * bVar180;
    bVar181 = (bVar181 < bVar117) * bVar117 | (bVar181 >= bVar117) * bVar181;
    bVar183 = (bVar216 < bVar118) * bVar118 | (bVar216 >= bVar118) * bVar216;
    auVar138 = psubusb(auVar139,auVar242);
    auVar161 = psubusb(auVar242,auVar139);
    auVar161 = auVar161 | auVar138;
    auVar138 = psubusb(auVar254,auVar251);
    auVar185 = psubusb(auVar251,auVar254);
    auVar185 = auVar185 | auVar138;
    bVar216 = auVar161[0];
    bVar187 = auVar185[0];
    bVar187 = (bVar187 < bVar216) * bVar216 | (bVar187 >= bVar216) * bVar187;
    bVar216 = auVar161[1];
    bVar189 = auVar185[1];
    bVar189 = (bVar189 < bVar216) * bVar216 | (bVar189 >= bVar216) * bVar189;
    bVar216 = auVar161[2];
    bVar190 = auVar185[2];
    bVar190 = (bVar190 < bVar216) * bVar216 | (bVar190 >= bVar216) * bVar190;
    bVar216 = auVar161[3];
    bVar193 = auVar185[3];
    bVar193 = (bVar193 < bVar216) * bVar216 | (bVar193 >= bVar216) * bVar193;
    bVar216 = auVar161[4];
    bVar194 = auVar185[4];
    bVar194 = (bVar194 < bVar216) * bVar216 | (bVar194 >= bVar216) * bVar194;
    bVar216 = auVar161[5];
    bVar197 = auVar185[5];
    bVar197 = (bVar197 < bVar216) * bVar216 | (bVar197 >= bVar216) * bVar197;
    bVar216 = auVar161[6];
    bVar198 = auVar185[6];
    bVar198 = (bVar198 < bVar216) * bVar216 | (bVar198 >= bVar216) * bVar198;
    bVar216 = auVar161[7];
    bVar201 = auVar185[7];
    bVar201 = (bVar201 < bVar216) * bVar216 | (bVar201 >= bVar216) * bVar201;
    bVar216 = auVar161[8];
    bVar202 = auVar185[8];
    bVar202 = (bVar202 < bVar216) * bVar216 | (bVar202 >= bVar216) * bVar202;
    bVar216 = auVar161[9];
    bVar205 = auVar185[9];
    bVar205 = (bVar205 < bVar216) * bVar216 | (bVar205 >= bVar216) * bVar205;
    bVar216 = auVar161[10];
    bVar206 = auVar185[10];
    bVar206 = (bVar206 < bVar216) * bVar216 | (bVar206 >= bVar216) * bVar206;
    bVar216 = auVar161[0xb];
    bVar209 = auVar185[0xb];
    bVar209 = (bVar209 < bVar216) * bVar216 | (bVar209 >= bVar216) * bVar209;
    bVar216 = auVar161[0xc];
    bVar210 = auVar185[0xc];
    bVar210 = (bVar210 < bVar216) * bVar216 | (bVar210 >= bVar216) * bVar210;
    bVar216 = auVar161[0xd];
    bVar213 = auVar185[0xd];
    bVar213 = (bVar213 < bVar216) * bVar216 | (bVar213 >= bVar216) * bVar213;
    bVar216 = auVar161[0xe];
    bVar214 = auVar185[0xe];
    bVar217 = auVar185[0xf];
    bVar214 = (bVar214 < bVar216) * bVar216 | (bVar214 >= bVar216) * bVar214;
    bVar216 = auVar161[0xf];
    bVar216 = (bVar217 < bVar216) * bVar216 | (bVar217 >= bVar216) * bVar217;
    bVar187 = (bVar187 < bVar158) * bVar158 | (bVar187 >= bVar158) * bVar187;
    bVar189 = (bVar189 < bVar162) * bVar162 | (bVar189 >= bVar162) * bVar189;
    bVar190 = (bVar190 < bVar163) * bVar163 | (bVar190 >= bVar163) * bVar190;
    bVar193 = (bVar193 < bVar165) * bVar165 | (bVar193 >= bVar165) * bVar193;
    bVar194 = (bVar194 < bVar166) * bVar166 | (bVar194 >= bVar166) * bVar194;
    bVar197 = (bVar197 < bVar168) * bVar168 | (bVar197 >= bVar168) * bVar197;
    bVar198 = (bVar198 < bVar169) * bVar169 | (bVar198 >= bVar169) * bVar198;
    bVar201 = (bVar201 < bVar171) * bVar171 | (bVar201 >= bVar171) * bVar201;
    bVar202 = (bVar202 < bVar172) * bVar172 | (bVar202 >= bVar172) * bVar202;
    bVar205 = (bVar205 < bVar174) * bVar174 | (bVar205 >= bVar174) * bVar205;
    bVar206 = (bVar206 < bVar175) * bVar175 | (bVar206 >= bVar175) * bVar206;
    bVar209 = (bVar209 < bVar177) * bVar177 | (bVar209 >= bVar177) * bVar209;
    bVar210 = (bVar210 < bVar178) * bVar178 | (bVar210 >= bVar178) * bVar210;
    bVar213 = (bVar213 < bVar180) * bVar180 | (bVar213 >= bVar180) * bVar213;
    bVar214 = (bVar214 < bVar181) * bVar181 | (bVar214 >= bVar181) * bVar214;
    bVar183 = (bVar216 < bVar183) * bVar183 | (bVar216 >= bVar183) * bVar216;
    bVar216 = DAT_004c7fb0;
    bVar158 = DAT_004c7fb0._1_1_;
    bVar162 = DAT_004c7fb0._2_1_;
    bVar163 = DAT_004c7fb0._3_1_;
    bVar165 = DAT_004c7fb0._4_1_;
    bVar166 = DAT_004c7fb0._5_1_;
    bVar168 = DAT_004c7fb0._6_1_;
    bVar169 = DAT_004c7fb0._7_1_;
    bVar171 = DAT_004c7fb0._8_1_;
    bVar172 = DAT_004c7fb0._9_1_;
    bVar174 = DAT_004c7fb0._10_1_;
    bVar175 = DAT_004c7fb0._11_1_;
    bVar177 = DAT_004c7fb0._12_1_;
    bVar178 = DAT_004c7fb0._13_1_;
    bVar180 = DAT_004c7fb0._14_1_;
    bVar181 = DAT_004c7fb0._15_1_;
    auVar186[0] = -((byte)((bVar216 < bVar187) * bVar216 | (bVar216 >= bVar187) * bVar187) ==
                   bVar187);
    auVar186[1] = -((byte)((bVar158 < bVar189) * bVar158 | (bVar158 >= bVar189) * bVar189) ==
                   bVar189);
    auVar186[2] = -((byte)((bVar162 < bVar190) * bVar162 | (bVar162 >= bVar190) * bVar190) ==
                   bVar190);
    auVar186[3] = -((byte)((bVar163 < bVar193) * bVar163 | (bVar163 >= bVar193) * bVar193) ==
                   bVar193);
    auVar186[4] = -((byte)((bVar165 < bVar194) * bVar165 | (bVar165 >= bVar194) * bVar194) ==
                   bVar194);
    auVar186[5] = -((byte)((bVar166 < bVar197) * bVar166 | (bVar166 >= bVar197) * bVar197) ==
                   bVar197);
    auVar186[6] = -((byte)((bVar168 < bVar198) * bVar168 | (bVar168 >= bVar198) * bVar198) ==
                   bVar198);
    auVar186[7] = -((byte)((bVar169 < bVar201) * bVar169 | (bVar169 >= bVar201) * bVar201) ==
                   bVar201);
    auVar186[8] = -((byte)((bVar171 < bVar202) * bVar171 | (bVar171 >= bVar202) * bVar202) ==
                   bVar202);
    auVar186[9] = -((byte)((bVar172 < bVar205) * bVar172 | (bVar172 >= bVar205) * bVar205) ==
                   bVar205);
    auVar186[10] = -((byte)((bVar174 < bVar206) * bVar174 | (bVar174 >= bVar206) * bVar206) ==
                    bVar206);
    auVar186[0xb] =
         -((byte)((bVar175 < bVar209) * bVar175 | (bVar175 >= bVar209) * bVar209) == bVar209);
    auVar186[0xc] =
         -((byte)((bVar177 < bVar210) * bVar177 | (bVar177 >= bVar210) * bVar210) == bVar210);
    auVar186[0xd] =
         -((byte)((bVar178 < bVar213) * bVar178 | (bVar178 >= bVar213) * bVar213) == bVar213);
    auVar186[0xe] =
         -((byte)((bVar180 < bVar214) * bVar180 | (bVar180 >= bVar214) * bVar214) == bVar214);
    auVar186[0xf] =
         -((byte)((bVar181 < bVar183) * bVar181 | (bVar181 >= bVar183) * bVar183) == bVar183);
    auVar186 = auVar186 & auVar102;
    bVar216 = *_thresh0;
    bVar158 = _thresh0[1];
    bVar162 = _thresh0[2];
    bVar163 = _thresh0[3];
    bVar165 = _thresh0[4];
    bVar166 = _thresh0[5];
    bVar168 = _thresh0[6];
    bVar169 = _thresh0[7];
    bVar171 = _thresh0[8];
    bVar172 = _thresh0[9];
    bVar174 = _thresh0[10];
    bVar175 = _thresh0[0xb];
    bVar177 = _thresh0[0xc];
    bVar178 = _thresh0[0xd];
    bVar180 = _thresh0[0xe];
    bVar181 = _thresh0[0xf];
    auVar219[0] = -((byte)((bVar101 < bVar216) * bVar101 | (bVar101 >= bVar216) * bVar216) ==
                   bVar101);
    auVar219[1] = -((byte)((bVar103 < bVar158) * bVar103 | (bVar103 >= bVar158) * bVar158) ==
                   bVar103);
    auVar219[2] = -((byte)((bVar104 < bVar162) * bVar104 | (bVar104 >= bVar162) * bVar162) ==
                   bVar104);
    auVar219[3] = -((byte)((bVar105 < bVar163) * bVar105 | (bVar105 >= bVar163) * bVar163) ==
                   bVar105);
    auVar219[4] = -((byte)((bVar106 < bVar165) * bVar106 | (bVar106 >= bVar165) * bVar165) ==
                   bVar106);
    auVar219[5] = -((byte)((bVar107 < bVar166) * bVar107 | (bVar107 >= bVar166) * bVar166) ==
                   bVar107);
    auVar219[6] = -((byte)((bVar108 < bVar168) * bVar108 | (bVar108 >= bVar168) * bVar168) ==
                   bVar108);
    auVar219[7] = -((byte)((bVar110 < bVar169) * bVar110 | (bVar110 >= bVar169) * bVar169) ==
                   bVar110);
    auVar219[8] = -((byte)((bVar111 < bVar171) * bVar111 | (bVar111 >= bVar171) * bVar171) ==
                   bVar111);
    auVar219[9] = -((byte)((bVar112 < bVar172) * bVar112 | (bVar112 >= bVar172) * bVar172) ==
                   bVar112);
    auVar219[10] = -((byte)((bVar113 < bVar174) * bVar113 | (bVar113 >= bVar174) * bVar174) ==
                    bVar113);
    auVar219[0xb] =
         -((byte)((bVar114 < bVar175) * bVar114 | (bVar114 >= bVar175) * bVar175) == bVar114);
    auVar219[0xc] =
         -((byte)((bVar115 < bVar177) * bVar115 | (bVar115 >= bVar177) * bVar177) == bVar115);
    auVar219[0xd] =
         -((byte)((bVar116 < bVar178) * bVar116 | (bVar116 >= bVar178) * bVar178) == bVar116);
    auVar219[0xe] =
         -((byte)((bVar117 < bVar180) * bVar117 | (bVar117 >= bVar180) * bVar180) == bVar117);
    auVar219[0xf] =
         -((byte)((bVar118 < bVar181) * bVar118 | (bVar118 >= bVar181) * bVar181) == bVar118);
    auVar138 = psubsb(auVar237 ^ _DAT_004c9320,auVar1 ^ _DAT_004c9320);
    auVar161 = psubsb(auVar251 ^ _DAT_004c9320,auVar242 ^ _DAT_004c9320);
    auVar138 = paddsb(~auVar219 & auVar138,auVar161);
    auVar138 = paddsb(auVar138,auVar161);
    auVar161 = paddsb(auVar138,auVar161);
    auVar138 = paddsb(_DAT_0050bbf0,auVar161 & auVar102);
    auVar250[0] = -(auVar138[0] < '\0');
    auVar250[1] = -(auVar138[1] < '\0');
    auVar250[2] = -(auVar138[2] < '\0');
    auVar250[3] = -(auVar138[3] < '\0');
    auVar250[4] = -(auVar138[4] < '\0');
    auVar250[5] = -(auVar138[5] < '\0');
    auVar250[6] = -(auVar138[6] < '\0');
    auVar250[7] = -(auVar138[7] < '\0');
    auVar250[8] = -(auVar138[8] < '\0');
    auVar250[9] = -(auVar138[9] < '\0');
    auVar250[10] = -(auVar138[10] < '\0');
    auVar250[0xb] = -(auVar138[0xb] < '\0');
    auVar250[0xc] = -(auVar138[0xc] < '\0');
    auVar250[0xd] = -(auVar138[0xd] < '\0');
    auVar250[0xe] = -(auVar138[0xe] < '\0');
    auVar250[0xf] = -(auVar138[0xf] < '\0');
    auVar185 = paddsb(auVar161 & auVar102,_DAT_0050bbe0);
    auVar161._0_2_ = auVar138._0_2_ >> 3;
    auVar161._2_2_ = auVar138._2_2_ >> 3;
    auVar161._4_2_ = auVar138._4_2_ >> 3;
    auVar161._6_2_ = auVar138._6_2_ >> 3;
    auVar161._8_2_ = auVar138._8_2_ >> 3;
    auVar161._10_2_ = auVar138._10_2_ >> 3;
    auVar161._12_2_ = auVar138._12_2_ >> 3;
    auVar161._14_2_ = auVar138._14_2_ >> 3;
    auVar102 = ~_DAT_004c7fe0 & auVar250 | auVar161 & _DAT_004c7fe0;
    auVar227[0] = -(auVar185[0] < '\0');
    auVar227[1] = -(auVar185[1] < '\0');
    auVar227[2] = -(auVar185[2] < '\0');
    auVar227[3] = -(auVar185[3] < '\0');
    auVar227[4] = -(auVar185[4] < '\0');
    auVar227[5] = -(auVar185[5] < '\0');
    auVar227[6] = -(auVar185[6] < '\0');
    auVar227[7] = -(auVar185[7] < '\0');
    auVar227[8] = -(auVar185[8] < '\0');
    auVar227[9] = -(auVar185[9] < '\0');
    auVar227[10] = -(auVar185[10] < '\0');
    auVar227[0xb] = -(auVar185[0xb] < '\0');
    auVar227[0xc] = -(auVar185[0xc] < '\0');
    auVar227[0xd] = -(auVar185[0xd] < '\0');
    auVar227[0xe] = -(auVar185[0xe] < '\0');
    auVar227[0xf] = -(auVar185[0xf] < '\0');
    auVar241._0_2_ = auVar185._0_2_ >> 3;
    auVar241._2_2_ = auVar185._2_2_ >> 3;
    auVar241._4_2_ = auVar185._4_2_ >> 3;
    auVar241._6_2_ = auVar185._6_2_ >> 3;
    auVar241._8_2_ = auVar185._8_2_ >> 3;
    auVar241._10_2_ = auVar185._10_2_ >> 3;
    auVar241._12_2_ = auVar185._12_2_ >> 3;
    auVar241._14_2_ = auVar185._14_2_ >> 3;
    auVar138 = psubsb(auVar251 ^ _DAT_004c9320,auVar102);
    auVar161 = paddsb(~_DAT_004c7fe0 & auVar227 | auVar241 & _DAT_004c7fe0,auVar242 ^ _DAT_004c9320)
    ;
    auVar102 = paddsb(auVar102,_DAT_004c7fb0);
    auVar185._0_2_ = auVar102._0_2_ >> 1;
    auVar185._2_2_ = auVar102._2_2_ >> 1;
    auVar185._4_2_ = auVar102._4_2_ >> 1;
    auVar185._6_2_ = auVar102._6_2_ >> 1;
    auVar185._8_2_ = auVar102._8_2_ >> 1;
    auVar185._10_2_ = auVar102._10_2_ >> 1;
    auVar185._12_2_ = auVar102._12_2_ >> 1;
    auVar185._14_2_ = auVar102._14_2_ >> 1;
    auVar219 = (~_DAT_004c7fc0 & auVar102 | auVar185 & _DAT_004c7fc0) & auVar219;
    auVar185 = paddsb(auVar237 ^ _DAT_004c9320,auVar219);
    auVar102 = psubsb(auVar1 ^ _DAT_004c9320,auVar219);
    auVar138 = auVar138 ^ _DAT_004c9320;
    auVar161 = auVar161 ^ _DAT_004c9320;
    auVar185 = auVar185 ^ _DAT_004c9320;
    auVar102 = auVar102 ^ _DAT_004c9320;
    if ((((((((((((((((auVar186 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar186 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar186 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar186 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar186 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar186 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar186 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar186 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar186 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar186 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar186 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar186 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar186 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar186 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar186 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar186[0xf])
    {
      local_98 = auVar185._0_8_;
      uStack_90 = auVar185._8_8_;
      *(undefined8 *)(s + lVar100 * -2) = local_98;
      *(undefined8 *)(s + lVar100 * -2 + 8) = uStack_90;
      *(undefined1 (*) [16])(s + -lVar100) = auVar161;
      local_88 = auVar138._0_8_;
      uStack_80 = auVar138._8_8_;
      *(undefined8 *)s = local_88;
      *(undefined8 *)(s + 8) = uStack_80;
      local_78 = auVar102._0_8_;
      uStack_70 = auVar102._8_8_;
      *(undefined8 *)(s + lVar100) = local_78;
      *(undefined8 *)(s + lVar100 + 8) = uStack_70;
    }
    else {
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar139._0_13_;
      auVar4[0xe] = auVar139[7];
      auVar12[0xc] = auVar139[6];
      auVar12._0_12_ = auVar139._0_12_;
      auVar12._13_2_ = auVar4._13_2_;
      auVar20[0xb] = 0;
      auVar20._0_11_ = auVar139._0_11_;
      auVar20._12_3_ = auVar12._12_3_;
      auVar28[10] = auVar139[5];
      auVar28._0_10_ = auVar139._0_10_;
      auVar28._11_4_ = auVar20._11_4_;
      auVar36[9] = 0;
      auVar36._0_9_ = auVar139._0_9_;
      auVar36._10_5_ = auVar28._10_5_;
      auVar44[8] = auVar139[4];
      auVar44._0_8_ = auVar139._0_8_;
      auVar44._9_6_ = auVar36._9_6_;
      auVar59._7_8_ = 0;
      auVar59._0_7_ = auVar44._8_7_;
      Var60 = CONCAT81(SUB158(auVar59 << 0x40,7),auVar139[3]);
      auVar84._9_6_ = 0;
      auVar84._0_9_ = Var60;
      auVar61._1_10_ = SUB1510(auVar84 << 0x30,5);
      auVar61[0] = auVar139[2];
      auVar85._11_4_ = 0;
      auVar85._0_11_ = auVar61;
      auVar52[2] = auVar139[1];
      auVar52._0_2_ = auVar139._0_2_;
      auVar52._3_12_ = SUB1512(auVar85 << 0x20,3);
      uVar252 = auVar139._0_2_ & 0xff;
      auVar5[0xd] = 0;
      auVar5._0_13_ = auVar228._0_13_;
      auVar5[0xe] = auVar228[7];
      auVar13[0xc] = auVar228[6];
      auVar13._0_12_ = auVar228._0_12_;
      auVar13._13_2_ = auVar5._13_2_;
      auVar21[0xb] = 0;
      auVar21._0_11_ = auVar228._0_11_;
      auVar21._12_3_ = auVar13._12_3_;
      auVar29[10] = auVar228[5];
      auVar29._0_10_ = auVar228._0_10_;
      auVar29._11_4_ = auVar21._11_4_;
      auVar37[9] = 0;
      auVar37._0_9_ = auVar228._0_9_;
      auVar37._10_5_ = auVar29._10_5_;
      auVar45[8] = auVar228[4];
      auVar45._0_8_ = auVar228._0_8_;
      auVar45._9_6_ = auVar37._9_6_;
      auVar62._7_8_ = 0;
      auVar62._0_7_ = auVar45._8_7_;
      Var63 = CONCAT81(SUB158(auVar62 << 0x40,7),auVar228[3]);
      auVar86._9_6_ = 0;
      auVar86._0_9_ = Var63;
      auVar64._1_10_ = SUB1510(auVar86 << 0x30,5);
      auVar64[0] = auVar228[2];
      auVar87._11_4_ = 0;
      auVar87._0_11_ = auVar64;
      auVar53[2] = auVar228[1];
      auVar53._0_2_ = auVar228._0_2_;
      auVar53._3_12_ = SUB1512(auVar87 << 0x20,3);
      uVar121 = auVar228._0_2_ & 0xff;
      auVar6[0xd] = 0;
      auVar6._0_13_ = auVar237._0_13_;
      auVar6[0xe] = auVar237[7];
      auVar14[0xc] = auVar237[6];
      auVar14._0_12_ = auVar237._0_12_;
      auVar14._13_2_ = auVar6._13_2_;
      auVar22[0xb] = 0;
      auVar22._0_11_ = auVar237._0_11_;
      auVar22._12_3_ = auVar14._12_3_;
      auVar30[10] = auVar237[5];
      auVar30._0_10_ = auVar237._0_10_;
      auVar30._11_4_ = auVar22._11_4_;
      auVar38[9] = 0;
      auVar38._0_9_ = auVar237._0_9_;
      auVar38._10_5_ = auVar30._10_5_;
      auVar46[8] = auVar237[4];
      auVar46._0_8_ = auVar237._0_8_;
      auVar46._9_6_ = auVar38._9_6_;
      auVar65._7_8_ = 0;
      auVar65._0_7_ = auVar46._8_7_;
      Var66 = CONCAT81(SUB158(auVar65 << 0x40,7),auVar237[3]);
      auVar88._9_6_ = 0;
      auVar88._0_9_ = Var66;
      auVar67._1_10_ = SUB1510(auVar88 << 0x30,5);
      auVar67[0] = auVar237[2];
      auVar89._11_4_ = 0;
      auVar89._0_11_ = auVar67;
      auVar68._1_12_ = SUB1512(auVar89 << 0x20,3);
      auVar68[0] = auVar237[1];
      uVar184 = (ushort)auVar237[0];
      auVar7[0xd] = 0;
      auVar7._0_13_ = auVar242._0_13_;
      auVar7[0xe] = auVar242[7];
      auVar15[0xc] = auVar242[6];
      auVar15._0_12_ = auVar242._0_12_;
      auVar15._13_2_ = auVar7._13_2_;
      auVar23[0xb] = 0;
      auVar23._0_11_ = auVar242._0_11_;
      auVar23._12_3_ = auVar15._12_3_;
      auVar31[10] = auVar242[5];
      auVar31._0_10_ = auVar242._0_10_;
      auVar31._11_4_ = auVar23._11_4_;
      auVar39[9] = 0;
      auVar39._0_9_ = auVar242._0_9_;
      auVar39._10_5_ = auVar31._10_5_;
      auVar47[8] = auVar242[4];
      auVar47._0_8_ = auVar242._0_8_;
      auVar47._9_6_ = auVar39._9_6_;
      auVar69._7_8_ = 0;
      auVar69._0_7_ = auVar47._8_7_;
      Var70 = CONCAT81(SUB158(auVar69 << 0x40,7),auVar242[3]);
      auVar90._9_6_ = 0;
      auVar90._0_9_ = Var70;
      auVar71._1_10_ = SUB1510(auVar90 << 0x30,5);
      auVar71[0] = auVar242[2];
      auVar91._11_4_ = 0;
      auVar91._0_11_ = auVar71;
      auVar54[2] = auVar242[1];
      auVar54._0_2_ = auVar242._0_2_;
      auVar54._3_12_ = SUB1512(auVar91 << 0x20,3);
      uVar239 = auVar242._0_2_ & 0xff;
      auVar8[0xd] = 0;
      auVar8._0_13_ = auVar251._0_13_;
      auVar8[0xe] = auVar251[7];
      auVar16[0xc] = auVar251[6];
      auVar16._0_12_ = auVar251._0_12_;
      auVar16._13_2_ = auVar8._13_2_;
      auVar24[0xb] = 0;
      auVar24._0_11_ = auVar251._0_11_;
      auVar24._12_3_ = auVar16._12_3_;
      auVar32[10] = auVar251[5];
      auVar32._0_10_ = auVar251._0_10_;
      auVar32._11_4_ = auVar24._11_4_;
      auVar40[9] = 0;
      auVar40._0_9_ = auVar251._0_9_;
      auVar40._10_5_ = auVar32._10_5_;
      auVar48[8] = auVar251[4];
      auVar48._0_8_ = auVar251._0_8_;
      auVar48._9_6_ = auVar40._9_6_;
      auVar72._7_8_ = 0;
      auVar72._0_7_ = auVar48._8_7_;
      Var73 = CONCAT81(SUB158(auVar72 << 0x40,7),auVar251[3]);
      auVar92._9_6_ = 0;
      auVar92._0_9_ = Var73;
      auVar74._1_10_ = SUB1510(auVar92 << 0x30,5);
      auVar74[0] = auVar251[2];
      auVar93._11_4_ = 0;
      auVar93._0_11_ = auVar74;
      auVar55[2] = auVar251[1];
      auVar55._0_2_ = auVar251._0_2_;
      auVar55._3_12_ = SUB1512(auVar93 << 0x20,3);
      uVar249 = auVar251._0_2_ & 0xff;
      auVar9[0xd] = 0;
      auVar9._0_13_ = auVar1._0_13_;
      auVar9[0xe] = auVar1[7];
      auVar17[0xc] = auVar1[6];
      auVar17._0_12_ = auVar1._0_12_;
      auVar17._13_2_ = auVar9._13_2_;
      auVar25[0xb] = 0;
      auVar25._0_11_ = auVar1._0_11_;
      auVar25._12_3_ = auVar17._12_3_;
      auVar33[10] = auVar1[5];
      auVar33._0_10_ = auVar1._0_10_;
      auVar33._11_4_ = auVar25._11_4_;
      auVar41[9] = 0;
      auVar41._0_9_ = auVar1._0_9_;
      auVar41._10_5_ = auVar33._10_5_;
      auVar49[8] = auVar1[4];
      auVar49._0_8_ = auVar1._0_8_;
      auVar49._9_6_ = auVar41._9_6_;
      auVar75._7_8_ = 0;
      auVar75._0_7_ = auVar49._8_7_;
      Var76 = CONCAT81(SUB158(auVar75 << 0x40,7),auVar1[3]);
      auVar94._9_6_ = 0;
      auVar94._0_9_ = Var76;
      auVar77._1_10_ = SUB1510(auVar94 << 0x30,5);
      auVar77[0] = auVar1[2];
      auVar95._11_4_ = 0;
      auVar95._0_11_ = auVar77;
      auVar56[2] = auVar1[1];
      auVar56._0_2_ = auVar1._0_2_;
      auVar56._3_12_ = SUB1512(auVar95 << 0x20,3);
      uVar238 = auVar1._0_2_ & 0xff;
      auVar10[0xd] = 0;
      auVar10._0_13_ = auVar2._0_13_;
      auVar10[0xe] = auVar2[7];
      auVar18[0xc] = auVar2[6];
      auVar18._0_12_ = auVar2._0_12_;
      auVar18._13_2_ = auVar10._13_2_;
      auVar26[0xb] = 0;
      auVar26._0_11_ = auVar2._0_11_;
      auVar26._12_3_ = auVar18._12_3_;
      auVar34[10] = auVar2[5];
      auVar34._0_10_ = auVar2._0_10_;
      auVar34._11_4_ = auVar26._11_4_;
      auVar42[9] = 0;
      auVar42._0_9_ = auVar2._0_9_;
      auVar42._10_5_ = auVar34._10_5_;
      auVar50[8] = auVar2[4];
      auVar50._0_8_ = auVar2._0_8_;
      auVar50._9_6_ = auVar42._9_6_;
      auVar78._7_8_ = 0;
      auVar78._0_7_ = auVar50._8_7_;
      Var79 = CONCAT81(SUB158(auVar78 << 0x40,7),auVar2[3]);
      auVar96._9_6_ = 0;
      auVar96._0_9_ = Var79;
      auVar80._1_10_ = SUB1510(auVar96 << 0x30,5);
      auVar80[0] = auVar2[2];
      auVar97._11_4_ = 0;
      auVar97._0_11_ = auVar80;
      auVar57[2] = auVar2[1];
      auVar57._0_2_ = auVar2._0_2_;
      auVar57._3_12_ = SUB1512(auVar97 << 0x20,3);
      uVar159 = auVar2._0_2_ & 0xff;
      auVar11[0xd] = 0;
      auVar11._0_13_ = auVar254._0_13_;
      auVar11[0xe] = auVar254[7];
      auVar19[0xc] = auVar254[6];
      auVar19._0_12_ = auVar254._0_12_;
      auVar19._13_2_ = auVar11._13_2_;
      auVar27[0xb] = 0;
      auVar27._0_11_ = auVar254._0_11_;
      auVar27._12_3_ = auVar19._12_3_;
      auVar35[10] = auVar254[5];
      auVar35._0_10_ = auVar254._0_10_;
      auVar35._11_4_ = auVar27._11_4_;
      auVar43[9] = 0;
      auVar43._0_9_ = auVar254._0_9_;
      auVar43._10_5_ = auVar35._10_5_;
      auVar51[8] = auVar254[4];
      auVar51._0_8_ = auVar254._0_8_;
      auVar51._9_6_ = auVar43._9_6_;
      auVar81._7_8_ = 0;
      auVar81._0_7_ = auVar51._8_7_;
      Var82 = CONCAT81(SUB158(auVar81 << 0x40,7),auVar254[3]);
      auVar98._9_6_ = 0;
      auVar98._0_9_ = Var82;
      auVar83._1_10_ = SUB1510(auVar98 << 0x30,5);
      auVar83[0] = auVar254[2];
      auVar99._11_4_ = 0;
      auVar99._0_11_ = auVar83;
      auVar58[2] = auVar254[1];
      auVar58._0_2_ = auVar254._0_2_;
      auVar58._3_12_ = SUB1512(auVar99 << 0x20,3);
      uVar240 = auVar254._0_2_ & 0xff;
      uVar236 = (ushort)auVar139[8];
      uVar218 = (ushort)auVar237[8];
      uVar123 = (ushort)auVar242[8];
      bVar216 = auVar242[10];
      bVar158 = auVar242[0xb];
      bVar162 = auVar242[0xc];
      bVar163 = auVar242[0xd];
      bVar165 = auVar242[0xe];
      bVar166 = auVar242[0xf];
      uVar135 = (ushort)auVar254[8];
      sVar125 = uVar249 + uVar121;
      sVar127 = auVar55._2_2_ + auVar53._2_2_;
      sVar128 = auVar74._0_2_ + auVar64._0_2_;
      sVar130 = (short)Var73;
      sVar148 = (short)Var63;
      sVar129 = sVar130 + sVar148;
      sVar131 = auVar48._8_2_ + auVar45._8_2_;
      sVar132 = auVar32._10_2_ + auVar29._10_2_;
      uVar119 = auVar8._13_2_ >> 8;
      sVar133 = auVar16._12_2_ + auVar13._12_2_;
      uVar120 = auVar5._13_2_ >> 8;
      sVar134 = uVar119 + uVar120;
      sVar141 = uVar121 + uVar252;
      sVar191 = auVar52._2_2_;
      sVar144 = auVar53._2_2_ + sVar191;
      sVar195 = auVar61._0_2_;
      sVar146 = auVar64._0_2_ + sVar195;
      sVar199 = (short)Var60;
      sVar148 = sVar148 + sVar199;
      sVar203 = auVar44._8_2_;
      sVar150 = auVar45._8_2_ + sVar203;
      sVar207 = auVar28._10_2_;
      sVar152 = auVar29._10_2_ + sVar207;
      sVar211 = auVar12._12_2_;
      sVar154 = auVar13._12_2_ + sVar211;
      uVar121 = auVar4._13_2_ >> 8;
      sVar156 = uVar120 + uVar121;
      sStack_a6 = auVar56._2_2_;
      sStack_a4 = auVar77._0_2_;
      sStack_a2 = (short)Var76;
      sStack_a0 = auVar49._8_2_;
      sStack_9e = auVar33._10_2_;
      sStack_9c = auVar17._12_2_;
      uVar122 = auVar9._13_2_ >> 8;
      sStack_f6 = auVar68._0_2_;
      sStack_f4 = auVar67._0_2_;
      sStack_f2 = (short)Var66;
      sStack_f0 = auVar46._8_2_;
      sStack_ee = auVar30._10_2_;
      sStack_ec = auVar14._12_2_;
      uVar140 = auVar6._13_2_ >> 8;
      sVar136 = uVar238 + uVar184;
      sVar137 = uVar122 + uVar140;
      sVar220 = auVar54._2_2_;
      sVar221 = auVar71._0_2_;
      sVar222 = (short)Var70;
      sVar223 = auVar47._8_2_;
      sVar224 = auVar31._10_2_;
      sVar225 = auVar15._12_2_;
      uVar120 = auVar7._13_2_ >> 8;
      uVar253 = uVar239 + 4 + uVar184 + sVar141 + uVar252 * 2 + sVar125;
      uVar255 = sVar220 + 4 + sStack_f6 + sVar144 + sVar191 * 2 + sVar127;
      uVar256 = sVar221 + 4 + sStack_f4 + sVar146 + sVar195 * 2 + sVar128;
      uVar257 = sVar222 + 4 + sStack_f2 + sVar148 + sVar199 * 2 + sVar129;
      uVar258 = sVar223 + 4 + sStack_f0 + sVar150 + sVar203 * 2 + sVar131;
      uVar259 = sVar224 + 4 + sStack_ee + sVar152 + sVar207 * 2 + sVar132;
      uVar260 = sVar225 + 4 + sStack_ec + sVar154 + sVar211 * 2 + sVar133;
      uVar261 = uVar120 + 4 + uVar140 + sVar156 + uVar121 * 2 + sVar134;
      uStack_c6 = (ushort)auVar139[9];
      uStack_c4 = (ushort)auVar139[10];
      uStack_c2 = (ushort)auVar139[0xb];
      uStack_c0 = (ushort)auVar139[0xc];
      uStack_be = (ushort)auVar139[0xd];
      uStack_bc = (ushort)auVar139[0xe];
      uStack_ba = (ushort)auVar139[0xf];
      uStack_106 = (ushort)auVar228[9];
      uStack_104 = (ushort)auVar228[10];
      uStack_102 = (ushort)auVar228[0xb];
      uStack_100 = (ushort)auVar228[0xc];
      uStack_fe = (ushort)auVar228[0xd];
      uStack_fc = (ushort)auVar228[0xe];
      uStack_fa = (ushort)auVar228[0xf];
      sVar160 = (ushort)auVar251[8] + (ushort)auVar228[8];
      sVar164 = auVar251[9] + uStack_106;
      sVar167 = auVar251[10] + uStack_104;
      sVar170 = auVar251[0xb] + uStack_102;
      sVar173 = auVar251[0xc] + uStack_100;
      sVar176 = auVar251[0xd] + uStack_fe;
      sVar179 = auVar251[0xe] + uStack_fc;
      sVar182 = auVar251[0xf] + uStack_fa;
      sVar126 = auVar228[8] + uVar236;
      uStack_e6 = (ushort)auVar237[9];
      uStack_e4 = (ushort)auVar237[10];
      uStack_e2 = (ushort)auVar237[0xb];
      uStack_e0 = (ushort)auVar237[0xc];
      uStack_de = (ushort)auVar237[0xd];
      uStack_dc = (ushort)auVar237[0xe];
      uStack_da = (ushort)auVar237[0xf];
      uVar124 = (ushort)auVar242[9];
      uVar188 = uVar123 + 4 + uVar218 + sVar126 + uVar236 * 2 + sVar160;
      uVar192 = uVar124 + 4 + uStack_e6 + uStack_106 + uStack_c6 + uStack_c6 * 2 + sVar164;
      uVar196 = bVar216 + 4 + uStack_e4 + uStack_104 + uStack_c4 + uStack_c4 * 2 + sVar167;
      uVar200 = bVar158 + 4 + uStack_e2 + uStack_102 + uStack_c2 + uStack_c2 * 2 + sVar170;
      uVar204 = bVar162 + 4 + uStack_e0 + uStack_100 + uStack_c0 + uStack_c0 * 2 + sVar173;
      uVar208 = bVar163 + 4 + uStack_de + uStack_fe + uStack_be + uStack_be * 2 + sVar176;
      uVar212 = bVar165 + 4 + uStack_dc + uStack_fc + uStack_bc + uStack_bc * 2 + sVar179;
      uVar215 = bVar166 + 4 + uStack_da + uStack_fa + uStack_ba + uStack_ba * 2 + sVar182;
      sVar243 = auVar58._2_2_;
      sVar244 = auVar83._0_2_;
      sVar245 = (short)Var82;
      sVar246 = auVar51._8_2_;
      sVar247 = auVar35._10_2_;
      sVar248 = auVar19._12_2_;
      uVar109 = auVar11._13_2_ >> 8;
      uStack_d6 = (ushort)auVar1[9];
      uStack_d4 = (ushort)auVar1[10];
      uStack_d2 = (ushort)auVar1[0xb];
      uStack_d0 = (ushort)auVar1[0xc];
      uStack_ce = (ushort)auVar1[0xd];
      uStack_cc = (ushort)auVar1[0xe];
      uStack_ca = (ushort)auVar1[0xf];
      sVar142 = auVar1[8] + uVar218;
      uStack_116 = (ushort)auVar254[9];
      uStack_114 = (ushort)auVar254[10];
      uStack_112 = (ushort)auVar254[0xb];
      uStack_110 = (ushort)auVar254[0xc];
      uStack_10e = (ushort)auVar254[0xd];
      uStack_10c = (ushort)auVar254[0xe];
      uStack_10a = (ushort)auVar254[0xf];
      uVar226 = (sVar136 - sVar141) + uVar253;
      uVar229 = ((sStack_a6 + sStack_f6) - sVar144) + uVar255;
      uVar230 = ((sStack_a4 + sStack_f4) - sVar146) + uVar256;
      uVar231 = ((sStack_a2 + sStack_f2) - sVar148) + uVar257;
      uVar232 = ((sStack_a0 + sStack_f0) - sVar150) + uVar258;
      uVar233 = ((sStack_9e + sStack_ee) - sVar152) + uVar259;
      uVar234 = ((sStack_9c + sStack_ec) - sVar154) + uVar260;
      uVar235 = (sVar137 - sVar156) + uVar261;
      uVar253 = uVar253 >> 3;
      uVar255 = uVar255 >> 3;
      uVar256 = uVar256 >> 3;
      uVar257 = uVar257 >> 3;
      uVar258 = uVar258 >> 3;
      uVar259 = uVar259 >> 3;
      uVar260 = uVar260 >> 3;
      uVar261 = uVar261 >> 3;
      uVar143 = (sVar142 - sVar126) + uVar188;
      uVar145 = ((uStack_d6 + uStack_e6) - (uStack_106 + uStack_c6)) + uVar192;
      uVar147 = ((uStack_d4 + uStack_e4) - (uStack_104 + uStack_c4)) + uVar196;
      uVar149 = ((uStack_d2 + uStack_e2) - (uStack_102 + uStack_c2)) + uVar200;
      uVar151 = ((uStack_d0 + uStack_e0) - (uStack_100 + uStack_c0)) + uVar204;
      uVar153 = ((uStack_ce + uStack_de) - (uStack_fe + uStack_be)) + uVar208;
      uVar155 = ((uStack_cc + uStack_dc) - (uStack_fc + uStack_bc)) + uVar212;
      uVar157 = ((uStack_ca + uStack_da) - (uStack_fa + uStack_ba)) + uVar215;
      uVar188 = uVar188 >> 3;
      uVar192 = uVar192 >> 3;
      uVar196 = uVar196 >> 3;
      uVar200 = uVar200 >> 3;
      uVar204 = uVar204 >> 3;
      uVar208 = uVar208 >> 3;
      uVar212 = uVar212 >> 3;
      uVar215 = uVar215 >> 3;
      auVar254[1] = (uVar255 != 0) * (uVar255 < 0x100) * (char)uVar255 - (0xff < uVar255);
      auVar254[0] = (uVar253 != 0) * (uVar253 < 0x100) * (char)uVar253 - (0xff < uVar253);
      auVar254[2] = (uVar256 != 0) * (uVar256 < 0x100) * (char)uVar256 - (0xff < uVar256);
      auVar254[3] = (uVar257 != 0) * (uVar257 < 0x100) * (char)uVar257 - (0xff < uVar257);
      auVar254[4] = (uVar258 != 0) * (uVar258 < 0x100) * (char)uVar258 - (0xff < uVar258);
      auVar254[5] = (uVar259 != 0) * (uVar259 < 0x100) * (char)uVar259 - (0xff < uVar259);
      auVar254[6] = (uVar260 != 0) * (uVar260 < 0x100) * (char)uVar260 - (0xff < uVar260);
      auVar254[7] = (uVar261 != 0) * (uVar261 < 0x100) * (char)uVar261 - (0xff < uVar261);
      auVar254[8] = (uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 - (0xff < uVar188);
      auVar254[9] = (uVar192 != 0) * (uVar192 < 0x100) * (char)uVar192 - (0xff < uVar192);
      auVar254[10] = (uVar196 != 0) * (uVar196 < 0x100) * (char)uVar196 - (0xff < uVar196);
      auVar254[0xb] = (uVar200 != 0) * (uVar200 < 0x100) * (char)uVar200 - (0xff < uVar200);
      auVar254[0xc] = (uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204);
      auVar254[0xd] = (uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208 - (0xff < uVar208);
      auVar254[0xe] = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
      auVar254[0xf] = (uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215);
      *(undefined1 (*) [16])(s + lVar100 * -3) = ~auVar186 & auVar228 | auVar254 & auVar186;
      sStack_16 = auVar57._2_2_;
      sStack_14 = auVar80._0_2_;
      sStack_12 = (short)Var79;
      sStack_10 = auVar50._8_2_;
      sStack_e = auVar34._10_2_;
      sStack_c = auVar18._12_2_;
      uVar188 = auVar10._13_2_ >> 8;
      uVar192 = (uVar239 - (uVar184 + uVar252)) + uVar159 + uVar226;
      uVar196 = (sVar220 - (sStack_f6 + sVar191)) + sStack_16 + uVar229;
      uVar200 = (sVar221 - (sStack_f4 + sVar195)) + sStack_14 + uVar230;
      uVar204 = (sVar222 - (sStack_f2 + sVar199)) + sStack_12 + uVar231;
      uVar208 = (sVar223 - (sStack_f0 + sVar203)) + sStack_10 + uVar232;
      uVar212 = (sVar224 - (sStack_ee + sVar207)) + sStack_e + uVar233;
      uVar215 = (sVar225 - (sStack_ec + sVar211)) + sStack_c + uVar234;
      uVar140 = (uVar120 - (uVar140 + uVar121)) + uVar188 + uVar235;
      uVar226 = uVar226 >> 3;
      uVar229 = uVar229 >> 3;
      uVar230 = uVar230 >> 3;
      uVar231 = uVar231 >> 3;
      uVar232 = uVar232 >> 3;
      uVar233 = uVar233 >> 3;
      uVar234 = uVar234 >> 3;
      uVar235 = uVar235 >> 3;
      uStack_26 = (ushort)auVar2[9];
      uStack_24 = (ushort)auVar2[10];
      uStack_22 = (ushort)auVar2[0xb];
      uStack_20 = (ushort)auVar2[0xc];
      uStack_1e = (ushort)auVar2[0xd];
      uStack_1c = (ushort)auVar2[0xe];
      uStack_1a = (ushort)auVar2[0xf];
      uVar218 = (uVar123 - (uVar218 + uVar236)) + (ushort)auVar2[8] + uVar143;
      uVar253 = (uVar124 - (uStack_e6 + uStack_c6)) + uStack_26 + uVar145;
      uVar255 = ((ushort)bVar216 - (uStack_e4 + uStack_c4)) + uStack_24 + uVar147;
      uVar256 = ((ushort)bVar158 - (uStack_e2 + uStack_c2)) + uStack_22 + uVar149;
      uVar257 = ((ushort)bVar162 - (uStack_e0 + uStack_c0)) + uStack_20 + uVar151;
      uVar258 = ((ushort)bVar163 - (uStack_de + uStack_be)) + uStack_1e + uVar153;
      uVar259 = ((ushort)bVar165 - (uStack_dc + uStack_bc)) + uStack_1c + uVar155;
      uVar260 = ((ushort)bVar166 - (uStack_da + uStack_ba)) + uStack_1a + uVar157;
      uVar143 = uVar143 >> 3;
      uVar145 = uVar145 >> 3;
      uVar147 = uVar147 >> 3;
      uVar149 = uVar149 >> 3;
      uVar151 = uVar151 >> 3;
      uVar153 = uVar153 >> 3;
      uVar155 = uVar155 >> 3;
      uVar157 = uVar157 >> 3;
      auVar228[1] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
      auVar228[0] = (uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226);
      auVar228[2] = (uVar230 != 0) * (uVar230 < 0x100) * (char)uVar230 - (0xff < uVar230);
      auVar228[3] = (uVar231 != 0) * (uVar231 < 0x100) * (char)uVar231 - (0xff < uVar231);
      auVar228[4] = (uVar232 != 0) * (uVar232 < 0x100) * (char)uVar232 - (0xff < uVar232);
      auVar228[5] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
      auVar228[6] = (uVar234 != 0) * (uVar234 < 0x100) * (char)uVar234 - (0xff < uVar234);
      auVar228[7] = (uVar235 != 0) * (uVar235 < 0x100) * (char)uVar235 - (0xff < uVar235);
      auVar228[8] = (uVar143 != 0) * (uVar143 < 0x100) * (char)uVar143 - (0xff < uVar143);
      auVar228[9] = (uVar145 != 0) * (uVar145 < 0x100) * (char)uVar145 - (0xff < uVar145);
      auVar228[10] = (uVar147 != 0) * (uVar147 < 0x100) * (char)uVar147 - (0xff < uVar147);
      auVar228[0xb] = (uVar149 != 0) * (uVar149 < 0x100) * (char)uVar149 - (0xff < uVar149);
      auVar228[0xc] = (uVar151 != 0) * (uVar151 < 0x100) * (char)uVar151 - (0xff < uVar151);
      auVar228[0xd] = (uVar153 != 0) * (uVar153 < 0x100) * (char)uVar153 - (0xff < uVar153);
      auVar228[0xe] = (uVar155 != 0) * (uVar155 < 0x100) * (char)uVar155 - (0xff < uVar155);
      auVar228[0xf] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar157 - (0xff < uVar157);
      *(undefined1 (*) [16])(s + lVar100 * -2) = ~auVar186 & auVar185 | auVar228 & auVar186;
      uVar157 = (uVar249 - (uVar239 + uVar252)) + uVar240 + uVar192;
      uVar252 = (auVar55._2_2_ - (sVar220 + sVar191)) + sVar243 + uVar196;
      uVar226 = (auVar74._0_2_ - (sVar221 + sVar195)) + sVar244 + uVar200;
      uVar229 = (sVar130 - (sVar222 + sVar199)) + sVar245 + uVar204;
      uVar230 = (auVar48._8_2_ - (sVar223 + sVar203)) + sVar246 + uVar208;
      uVar231 = (auVar32._10_2_ - (sVar224 + sVar207)) + sVar247 + uVar212;
      uVar232 = (auVar16._12_2_ - (sVar225 + sVar211)) + sVar248 + uVar215;
      uVar233 = (uVar119 - (uVar120 + uVar121)) + uVar109 + uVar140;
      uVar192 = uVar192 >> 3;
      uVar196 = uVar196 >> 3;
      uVar200 = uVar200 >> 3;
      uVar204 = uVar204 >> 3;
      uVar208 = uVar208 >> 3;
      uVar212 = uVar212 >> 3;
      uVar215 = uVar215 >> 3;
      uVar140 = uVar140 >> 3;
      uVar184 = ((ushort)auVar251[8] - (uVar123 + uVar236)) + uVar135 + uVar218;
      uVar143 = ((ushort)auVar251[9] - (uVar124 + uStack_c6)) + uStack_116 + uVar253;
      uVar145 = ((ushort)auVar251[10] - (bVar216 + uStack_c4)) + uStack_114 + uVar255;
      uVar147 = ((ushort)auVar251[0xb] - (bVar158 + uStack_c2)) + uStack_112 + uVar256;
      uVar149 = ((ushort)auVar251[0xc] - (bVar162 + uStack_c0)) + uStack_110 + uVar257;
      uVar151 = ((ushort)auVar251[0xd] - (bVar163 + uStack_be)) + uStack_10e + uVar258;
      uVar153 = ((ushort)auVar251[0xe] - (bVar165 + uStack_bc)) + uStack_10c + uVar259;
      uVar155 = ((ushort)auVar251[0xf] - (bVar166 + uStack_ba)) + uStack_10a + uVar260;
      uVar218 = uVar218 >> 3;
      uVar253 = uVar253 >> 3;
      uVar255 = uVar255 >> 3;
      uVar256 = uVar256 >> 3;
      uVar257 = uVar257 >> 3;
      uVar258 = uVar258 >> 3;
      uVar259 = uVar259 >> 3;
      uVar260 = uVar260 >> 3;
      auVar139[1] = (uVar196 != 0) * (uVar196 < 0x100) * (char)uVar196 - (0xff < uVar196);
      auVar139[0] = (uVar192 != 0) * (uVar192 < 0x100) * (char)uVar192 - (0xff < uVar192);
      auVar139[2] = (uVar200 != 0) * (uVar200 < 0x100) * (char)uVar200 - (0xff < uVar200);
      auVar139[3] = (uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204);
      auVar139[4] = (uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208 - (0xff < uVar208);
      auVar139[5] = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
      auVar139[6] = (uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215);
      auVar139[7] = (uVar140 != 0) * (uVar140 < 0x100) * (char)uVar140 - (0xff < uVar140);
      auVar139[8] = (uVar218 != 0) * (uVar218 < 0x100) * (char)uVar218 - (0xff < uVar218);
      auVar139[9] = (uVar253 != 0) * (uVar253 < 0x100) * (char)uVar253 - (0xff < uVar253);
      auVar139[10] = (uVar255 != 0) * (uVar255 < 0x100) * (char)uVar255 - (0xff < uVar255);
      auVar139[0xb] = (uVar256 != 0) * (uVar256 < 0x100) * (char)uVar256 - (0xff < uVar256);
      auVar139[0xc] = (uVar257 != 0) * (uVar257 < 0x100) * (char)uVar257 - (0xff < uVar257);
      auVar139[0xd] = (uVar258 != 0) * (uVar258 < 0x100) * (char)uVar258 - (0xff < uVar258);
      auVar139[0xe] = (uVar259 != 0) * (uVar259 < 0x100) * (char)uVar259 - (0xff < uVar259);
      auVar139[0xf] = (uVar260 != 0) * (uVar260 < 0x100) * (char)uVar260 - (0xff < uVar260);
      *(undefined1 (*) [16])(s + -lVar100) = ~auVar186 & auVar161 | auVar139 & auVar186;
      uVar192 = (uVar238 - sVar125) + uVar240 + uVar157;
      uVar200 = (sStack_a6 - sVar127) + sVar243 + uVar252;
      uVar208 = (sStack_a4 - sVar128) + sVar244 + uVar226;
      uVar215 = (sStack_a2 - sVar129) + sVar245 + uVar229;
      uVar238 = (sStack_a0 - sVar131) + sVar246 + uVar230;
      uVar239 = (sStack_9e - sVar132) + sVar247 + uVar231;
      uVar255 = (sStack_9c - sVar133) + sVar248 + uVar232;
      uVar257 = (uVar122 - sVar134) + uVar109 + uVar233;
      uVar157 = uVar157 >> 3;
      uVar252 = uVar252 >> 3;
      uVar226 = uVar226 >> 3;
      uVar229 = uVar229 >> 3;
      uVar230 = uVar230 >> 3;
      uVar231 = uVar231 >> 3;
      uVar232 = uVar232 >> 3;
      uVar233 = uVar233 >> 3;
      uVar119 = uVar184 >> 3;
      uVar120 = uVar143 >> 3;
      uVar121 = uVar145 >> 3;
      uVar122 = uVar147 >> 3;
      uVar140 = uVar149 >> 3;
      uVar218 = uVar151 >> 3;
      uVar123 = uVar153 >> 3;
      uVar124 = uVar155 >> 3;
      auVar251[1] = (uVar252 != 0) * (uVar252 < 0x100) * (char)uVar252 - (0xff < uVar252);
      auVar251[0] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar157 - (0xff < uVar157);
      auVar251[2] = (uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226);
      auVar251[3] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
      auVar251[4] = (uVar230 != 0) * (uVar230 < 0x100) * (char)uVar230 - (0xff < uVar230);
      auVar251[5] = (uVar231 != 0) * (uVar231 < 0x100) * (char)uVar231 - (0xff < uVar231);
      auVar251[6] = (uVar232 != 0) * (uVar232 < 0x100) * (char)uVar232 - (0xff < uVar232);
      auVar251[7] = (uVar233 != 0) * (uVar233 < 0x100) * (char)uVar233 - (0xff < uVar233);
      auVar251[8] = (uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119);
      auVar251[9] = (uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 - (0xff < uVar120);
      auVar251[10] = (uVar121 != 0) * (uVar121 < 0x100) * (char)uVar121 - (0xff < uVar121);
      auVar251[0xb] = (uVar122 != 0) * (uVar122 < 0x100) * (char)uVar122 - (0xff < uVar122);
      auVar251[0xc] = (uVar140 != 0) * (uVar140 < 0x100) * (char)uVar140 - (0xff < uVar140);
      auVar251[0xd] = (uVar218 != 0) * (uVar218 < 0x100) * (char)uVar218 - (0xff < uVar218);
      auVar251[0xe] = (uVar123 != 0) * (uVar123 < 0x100) * (char)uVar123 - (0xff < uVar123);
      auVar251[0xf] = (uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124);
      *(undefined1 (*) [16])s = ~auVar186 & auVar138 | auVar251 & auVar186;
      uVar184 = ((ushort)auVar1[8] - sVar160) + uVar135 + uVar184;
      uVar143 = (uStack_d6 - sVar164) + uStack_116 + uVar143;
      uVar145 = (uStack_d4 - sVar167) + uStack_114 + uVar145;
      uVar147 = (uStack_d2 - sVar170) + uStack_112 + uVar147;
      uVar149 = (uStack_d0 - sVar173) + uStack_110 + uVar149;
      uVar151 = (uStack_ce - sVar176) + uStack_10e + uVar151;
      uVar153 = (uStack_cc - sVar179) + uStack_10c + uVar153;
      uVar155 = (uStack_ca - sVar182) + uStack_10a + uVar155;
      uVar196 = uVar192 >> 3;
      uVar204 = uVar200 >> 3;
      uVar212 = uVar208 >> 3;
      uVar157 = uVar215 >> 3;
      uVar252 = uVar238 >> 3;
      uVar253 = uVar239 >> 3;
      uVar256 = uVar255 >> 3;
      uVar258 = uVar257 >> 3;
      uVar119 = uVar184 >> 3;
      uVar120 = uVar143 >> 3;
      uVar121 = uVar145 >> 3;
      uVar122 = uVar147 >> 3;
      uVar140 = uVar149 >> 3;
      uVar218 = uVar151 >> 3;
      uVar123 = uVar153 >> 3;
      uVar124 = uVar155 >> 3;
      auVar237[1] = (uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204);
      auVar237[0] = (uVar196 != 0) * (uVar196 < 0x100) * (char)uVar196 - (0xff < uVar196);
      auVar237[2] = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
      auVar237[3] = (uVar157 != 0) * (uVar157 < 0x100) * (char)uVar157 - (0xff < uVar157);
      auVar237[4] = (uVar252 != 0) * (uVar252 < 0x100) * (char)uVar252 - (0xff < uVar252);
      auVar237[5] = (uVar253 != 0) * (uVar253 < 0x100) * (char)uVar253 - (0xff < uVar253);
      auVar237[6] = (uVar256 != 0) * (uVar256 < 0x100) * (char)uVar256 - (0xff < uVar256);
      auVar237[7] = (uVar258 != 0) * (uVar258 < 0x100) * (char)uVar258 - (0xff < uVar258);
      auVar237[8] = (uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119);
      auVar237[9] = (uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 - (0xff < uVar120);
      auVar237[10] = (uVar121 != 0) * (uVar121 < 0x100) * (char)uVar121 - (0xff < uVar121);
      auVar237[0xb] = (uVar122 != 0) * (uVar122 < 0x100) * (char)uVar122 - (0xff < uVar122);
      auVar237[0xc] = (uVar140 != 0) * (uVar140 < 0x100) * (char)uVar140 - (0xff < uVar140);
      auVar237[0xd] = (uVar218 != 0) * (uVar218 < 0x100) * (char)uVar218 - (0xff < uVar218);
      auVar237[0xe] = (uVar123 != 0) * (uVar123 < 0x100) * (char)uVar123 - (0xff < uVar123);
      auVar237[0xf] = (uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124);
      *(undefined1 (*) [16])(s + lVar100) = ~auVar186 & auVar102 | auVar237 & auVar186;
      uVar123 = (ushort)((uVar240 - sVar136) + uVar159 + uVar192) >> 3;
      uVar124 = (ushort)((sVar243 - (sStack_a6 + sStack_f6)) + sStack_16 + uVar200) >> 3;
      uVar192 = (ushort)((sVar244 - (sStack_a4 + sStack_f4)) + sStack_14 + uVar208) >> 3;
      uVar196 = (ushort)((sVar245 - (sStack_a2 + sStack_f2)) + sStack_12 + uVar215) >> 3;
      uVar200 = (ushort)((sVar246 - (sStack_a0 + sStack_f0)) + sStack_10 + uVar238) >> 3;
      uVar204 = (ushort)((sVar247 - (sStack_9e + sStack_ee)) + sStack_e + uVar239) >> 3;
      uVar208 = (ushort)((sVar248 - (sStack_9c + sStack_ec)) + sStack_c + uVar255) >> 3;
      uVar212 = (ushort)((uVar109 - sVar137) + uVar188 + uVar257) >> 3;
      uVar119 = (ushort)((uVar135 - sVar142) + (ushort)auVar2[8] + uVar184) >> 3;
      uVar120 = (ushort)((uStack_116 - (uStack_d6 + uStack_e6)) + uStack_26 + uVar143) >> 3;
      uVar121 = (ushort)((uStack_114 - (uStack_d4 + uStack_e4)) + uStack_24 + uVar145) >> 3;
      uVar109 = (ushort)((uStack_112 - (uStack_d2 + uStack_e2)) + uStack_22 + uVar147) >> 3;
      uVar122 = (ushort)((uStack_110 - (uStack_d0 + uStack_e0)) + uStack_20 + uVar149) >> 3;
      uVar140 = (ushort)((uStack_10e - (uStack_ce + uStack_de)) + uStack_1e + uVar151) >> 3;
      uVar188 = (ushort)((uStack_10c - (uStack_cc + uStack_dc)) + uStack_1c + uVar153) >> 3;
      uVar218 = (ushort)((uStack_10a - (uStack_ca + uStack_da)) + uStack_1a + uVar155) >> 3;
      auVar242[1] = (uVar124 != 0) * (uVar124 < 0x100) * (char)uVar124 - (0xff < uVar124);
      auVar242[0] = (uVar123 != 0) * (uVar123 < 0x100) * (char)uVar123 - (0xff < uVar123);
      auVar242[2] = (uVar192 != 0) * (uVar192 < 0x100) * (char)uVar192 - (0xff < uVar192);
      auVar242[3] = (uVar196 != 0) * (uVar196 < 0x100) * (char)uVar196 - (0xff < uVar196);
      auVar242[4] = (uVar200 != 0) * (uVar200 < 0x100) * (char)uVar200 - (0xff < uVar200);
      auVar242[5] = (uVar204 != 0) * (uVar204 < 0x100) * (char)uVar204 - (0xff < uVar204);
      auVar242[6] = (uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208 - (0xff < uVar208);
      auVar242[7] = (uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212);
      auVar242[8] = (uVar119 != 0) * (uVar119 < 0x100) * (char)uVar119 - (0xff < uVar119);
      auVar242[9] = (uVar120 != 0) * (uVar120 < 0x100) * (char)uVar120 - (0xff < uVar120);
      auVar242[10] = (uVar121 != 0) * (uVar121 < 0x100) * (char)uVar121 - (0xff < uVar121);
      auVar242[0xb] = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
      auVar242[0xc] = (uVar122 != 0) * (uVar122 < 0x100) * (char)uVar122 - (0xff < uVar122);
      auVar242[0xd] = (uVar140 != 0) * (uVar140 < 0x100) * (char)uVar140 - (0xff < uVar140);
      auVar242[0xe] = (uVar188 != 0) * (uVar188 < 0x100) * (char)uVar188 - (0xff < uVar188);
      auVar242[0xf] = (uVar218 != 0) * (uVar218 < 0x100) * (char)uVar218 - (0xff < uVar218);
      *(undefined1 (*) [16])(s + lVar100 * 2) = ~auVar186 & auVar2 | auVar242 & auVar186;
    }
  }
  return;
}

Assistant:

void aom_lpf_horizontal_8_quad_sse2(unsigned char *s, int p,
                                    const unsigned char *_blimit0,
                                    const unsigned char *_limit0,
                                    const unsigned char *_thresh0) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi8(1);
  const __m128i blimit_v = _mm_load_si128((const __m128i *)_blimit0);
  const __m128i limit_v = _mm_load_si128((const __m128i *)_limit0);
  const __m128i thresh_v = _mm_load_si128((const __m128i *)_thresh0);
  __m128i mask, hev, flat;
  __m128i p3, p2, p1, p0, q0, q1, q2, q3;

  __m128i op2, op1, op0, oq0, oq1, oq2;

  __m128i max_abs_p1p0q1q0;

  p3 = _mm_loadu_si128((__m128i *)(s - 4 * p));
  p2 = _mm_loadu_si128((__m128i *)(s - 3 * p));
  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s - 0 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  q2 = _mm_loadu_si128((__m128i *)(s + 2 * p));
  q3 = _mm_loadu_si128((__m128i *)(s + 3 * p));

  {
    const __m128i abs_p1p0 = abs_diff(p1, p0);
    const __m128i abs_q1q0 = abs_diff(q1, q0);
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i ff = _mm_cmpeq_epi8(zero, zero);
    __m128i abs_p0q0 = abs_diff(p0, q0);
    __m128i abs_p1q1 = abs_diff(p1, q1);
    __m128i work;
    max_abs_p1p0q1q0 = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(max_abs_p1p0q1q0, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    work = _mm_max_epu8(abs_diff(p2, p1), abs_diff(p3, p2));
    mask = _mm_max_epu8(work, mask);
    work = _mm_max_epu8(abs_diff(q2, q1), abs_diff(q3, q2));
    mask = _mm_max_epu8(work, mask);
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  {
    __m128i work;
    work = _mm_max_epu8(abs_diff(p2, p0), abs_diff(q2, q0));
    flat = _mm_max_epu8(work, max_abs_p1p0q1q0);
    work = _mm_max_epu8(abs_diff(p3, p0), abs_diff(q3, q0));
    flat = _mm_max_epu8(work, flat);
    flat = _mm_subs_epu8(flat, one);
    flat = _mm_cmpeq_epi8(flat, zero);
    flat = _mm_and_si128(flat, mask);
  }

  // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
  // filter4
  {
    const __m128i t4 = _mm_set1_epi8(4);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t1 = _mm_set1_epi8(0x1);
    const __m128i t7f = _mm_set1_epi8(0x7f);
    const __m128i ff = _mm_cmpeq_epi8(t4, t4);

    __m128i filt;
    __m128i work_a;
    __m128i filter1, filter2;

    op1 = _mm_xor_si128(p1, t80);
    op0 = _mm_xor_si128(p0, t80);
    oq0 = _mm_xor_si128(q0, t80);
    oq1 = _mm_xor_si128(q1, t80);

    hev = _mm_subs_epu8(max_abs_p1p0q1q0, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);
    filt = _mm_and_si128(_mm_subs_epi8(op1, oq1), hev);

    work_a = _mm_subs_epi8(oq0, op0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);
    filter1 = _mm_adds_epi8(filt, t4);
    filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    oq0 = _mm_xor_si128(_mm_subs_epi8(oq0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    op0 = _mm_xor_si128(_mm_adds_epi8(op0, filter2), t80);

    filt = _mm_adds_epi8(filter1, t1);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    op1 = _mm_xor_si128(_mm_adds_epi8(op1, filt), t80);
    oq1 = _mm_xor_si128(_mm_subs_epi8(oq1, filt), t80);

    // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
    // filter8
    if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat, zero))) {
      const __m128i four = _mm_set1_epi16(4);
      const __m128i p3_lo = _mm_unpacklo_epi8(p3, zero);
      const __m128i p2_lo = _mm_unpacklo_epi8(p2, zero);
      const __m128i p1_lo = _mm_unpacklo_epi8(p1, zero);
      const __m128i p0_lo = _mm_unpacklo_epi8(p0, zero);
      const __m128i q0_lo = _mm_unpacklo_epi8(q0, zero);
      const __m128i q1_lo = _mm_unpacklo_epi8(q1, zero);
      const __m128i q2_lo = _mm_unpacklo_epi8(q2, zero);
      const __m128i q3_lo = _mm_unpacklo_epi8(q3, zero);

      const __m128i p3_hi = _mm_unpackhi_epi8(p3, zero);
      const __m128i p2_hi = _mm_unpackhi_epi8(p2, zero);
      const __m128i p1_hi = _mm_unpackhi_epi8(p1, zero);
      const __m128i p0_hi = _mm_unpackhi_epi8(p0, zero);
      const __m128i q0_hi = _mm_unpackhi_epi8(q0, zero);
      const __m128i q1_hi = _mm_unpackhi_epi8(q1, zero);
      const __m128i q2_hi = _mm_unpackhi_epi8(q2, zero);
      const __m128i q3_hi = _mm_unpackhi_epi8(q3, zero);
      __m128i f8_lo, f8_hi;

      f8_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, four),
                            _mm_add_epi16(p3_lo, p2_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, f8_lo),
                            _mm_add_epi16(p2_lo, p1_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p0_lo, q0_lo), f8_lo);

      f8_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, four),
                            _mm_add_epi16(p3_hi, p2_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, f8_hi),
                            _mm_add_epi16(p2_hi, p1_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p0_hi, q0_hi), f8_hi);

      op2 = filter8_mask(&flat, &p2, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s - 3 * p), op2);

      f8_lo = filter_add2_sub2(&f8_lo, &q1_lo, &p1_lo, &p2_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q1_hi, &p1_hi, &p2_hi, &p3_hi);
      op1 = filter8_mask(&flat, &op1, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s - 2 * p), op1);

      f8_lo = filter_add2_sub2(&f8_lo, &q2_lo, &p0_lo, &p1_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q2_hi, &p0_hi, &p1_hi, &p3_hi);
      op0 = filter8_mask(&flat, &op0, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s - 1 * p), op0);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q0_lo, &p0_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q0_hi, &p0_hi, &p3_hi);
      oq0 = filter8_mask(&flat, &oq0, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q1_lo, &q0_lo, &p2_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q1_hi, &q0_hi, &p2_hi);
      oq1 = filter8_mask(&flat, &oq1, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q2_lo, &q1_lo, &p1_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q2_hi, &q1_hi, &p1_hi);
      oq2 = filter8_mask(&flat, &q2, &f8_lo, &f8_hi);
      _mm_storeu_si128((__m128i *)(s + 2 * p), oq2);
    } else {
      _mm_storeu_si128((__m128i *)(s - 2 * p), op1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), op0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);
    }
  }
}